

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O3

int lws_wsi_inject_to_loop(lws_context_per_thread *pt,lws *wsi)

{
  _func_int_lws_ptr *p_Var1;
  int iVar2;
  lws_context *context;
  
  context = pt->context;
  p_Var1 = context->event_loop_ops->sock_accept;
  if (p_Var1 != (_func_int_lws_ptr *)0x0) {
    iVar2 = (*p_Var1)(wsi);
    if (iVar2 != 0) {
      return 1;
    }
    context = pt->context;
  }
  iVar2 = __insert_wsi_socket_into_fds(context,wsi);
  return (uint)(iVar2 != 0);
}

Assistant:

int
lws_wsi_inject_to_loop(struct lws_context_per_thread *pt, struct lws *wsi)
{
	int ret = 1;

	lws_pt_lock(pt, __func__); /* -------------- pt { */

	if (pt->context->event_loop_ops->sock_accept)
		if (pt->context->event_loop_ops->sock_accept(wsi))
			goto bail;

	if (__insert_wsi_socket_into_fds(pt->context, wsi))
		goto bail;

	ret = 0;

bail:
	lws_pt_unlock(pt);

	return ret;
}